

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

string * __thiscall
chaiscript::eval::Logical_And_AST_Node::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,Logical_And_AST_Node *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  AST_Node::pretty_print_abi_cxx11_(&local_30,&this->super_AST_Node);
  std::operator+(&local_50,"(",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE
        {
          return "(" + AST_Node::pretty_print() + ")";
        }